

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_galileo_rev_g.c
# Opt level: O0

mraa_result_t mraa_intel_galileo_g2_mmap_setup(mraa_gpio_context dev,mraa_boolean_t en)

{
  mraa_pin_t meta;
  mraa_boolean_t mVar1;
  mraa_result_t mVar2;
  undefined4 in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined4 local_20;
  mraa_boolean_t en_local;
  mraa_gpio_context dev_local;
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"Galileo mmap: context not valid");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    mVar1 = mraa_pin_mode_test(dev->phy_pin,MRAA_PIN_FAST_GPIO);
    if (mVar1 == 0) {
      syslog(3,"Galileo mmap: mmap not on this pin");
      dev_local._4_4_ = MRAA_ERROR_NO_RESOURCES;
    }
    else if (en == 0) {
      if (dev->mmap_write == (_func_mraa_result_t_mraa_gpio_context_int *)0x0) {
        syslog(3,"mmap: can\'t disable disabled mmap gpio");
        dev_local._4_4_ = MRAA_ERROR_INVALID_PARAMETER;
      }
      else {
        dev->mmap_write = (_func_mraa_result_t_mraa_gpio_context_int *)0x0;
        mmap_count = mmap_count - 1;
        if (mmap_count == 0) {
          dev_local._4_4_ = mraa_intel_galileo_g2_mmap_unsetup();
        }
        else {
          dev_local._4_4_ = MRAA_SUCCESS;
        }
      }
    }
    else if (dev->mmap_write == (_func_mraa_result_t_mraa_gpio_context_int *)0x0) {
      if (mmap_reg == (uint8_t *)0x0) {
        mmap_fd = open("/dev/uio0",2);
        if (mmap_fd < 0) {
          syslog(3,"mmap: Unable to open UIO device");
          return MRAA_ERROR_INVALID_RESOURCE;
        }
        mmap_reg = (uint8_t *)mmap((void *)0x0,(long)mmap_size,3,1,mmap_fd,0);
        if (mmap_reg == (uint8_t *)0xffffffffffffffff) {
          syslog(3,"mmap: failed to mmap");
          mmap_reg = (uint8_t *)0x0;
          close(mmap_fd);
          return MRAA_ERROR_NO_RESOURCES;
        }
      }
      memcpy(&stack0xffffffffffffff80,&plat->pins[dev->phy_pin].mmap.gpio,100);
      meta._8_8_ = local_70;
      meta._0_8_ = uStack_78;
      meta.mux[0]._4_8_ = uStack_68;
      meta.mux[1]._0_8_ = local_60;
      meta.mux._20_8_ = uStack_58;
      meta.mux[2]._4_8_ = local_50;
      meta.mux[3]._0_8_ = uStack_48;
      meta.mux._44_8_ = local_40;
      meta.mux[4]._4_8_ = uStack_38;
      meta.mux[5]._0_8_ = local_30;
      meta._80_8_ = uStack_28;
      meta.complex_cap = (mraa_pin_cap_complex_t)local_20;
      meta.gpio_chip = in_stack_ffffffffffffff7c;
      meta.gpio_line = in_stack_ffffffffffffff80;
      mVar2 = mraa_setup_mux_mapped(meta);
      if (mVar2 == MRAA_SUCCESS) {
        dev->mmap_write = mraa_intel_galileo_g2_mmap_write;
        dev_local._4_4_ = MRAA_SUCCESS;
      }
      else {
        syslog(3,"mmap: unable to setup required multiplexers");
        dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
      }
    }
    else {
      syslog(3,"mmap: can\'t enable enabled mmap gpio");
      dev_local._4_4_ = MRAA_ERROR_INVALID_PARAMETER;
    }
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_intel_galileo_g2_mmap_setup(mraa_gpio_context dev, mraa_boolean_t en)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "Galileo mmap: context not valid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (mraa_pin_mode_test(dev->phy_pin, MRAA_PIN_FAST_GPIO) == 0) {
        syslog(LOG_ERR, "Galileo mmap: mmap not on this pin");
        return MRAA_ERROR_NO_RESOURCES;
    }
    if (en == 0) {
        if (dev->mmap_write == NULL) {
            syslog(LOG_ERR, "mmap: can't disable disabled mmap gpio");
            return MRAA_ERROR_INVALID_PARAMETER;
        }
        dev->mmap_write = NULL;
        mmap_count--;
        if (mmap_count == 0) {
            return mraa_intel_galileo_g2_mmap_unsetup();
        }
        return MRAA_SUCCESS;
    }

    if (dev->mmap_write != NULL) {
        syslog(LOG_ERR, "mmap: can't enable enabled mmap gpio");
        return MRAA_ERROR_INVALID_PARAMETER;
    }
    if (mmap_reg == NULL) {
        if ((mmap_fd = open(UIO_PATH, O_RDWR)) < 0) {
            syslog(LOG_ERR, "mmap: Unable to open UIO device");
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        mmap_reg = mmap(NULL, mmap_size, PROT_READ | PROT_WRITE, MAP_SHARED, mmap_fd, 0);

        if (mmap_reg == MAP_FAILED) {
            syslog(LOG_ERR, "mmap: failed to mmap");
            mmap_reg = NULL;
            close(mmap_fd);
            return MRAA_ERROR_NO_RESOURCES;
        }
    }
    if (mraa_setup_mux_mapped(plat->pins[dev->phy_pin].mmap.gpio) != MRAA_SUCCESS) {
        syslog(LOG_ERR, "mmap: unable to setup required multiplexers");
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    dev->mmap_write = &mraa_intel_galileo_g2_mmap_write;
    return MRAA_SUCCESS;
}